

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O0

void __thiscall HighsSimplexAnalysis::summaryReport(HighsSimplexAnalysis *this)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long in_RDI;
  int iVar6;
  double dVar7;
  double use_costly_dse;
  double use_DSE_density;
  HighsInt pct;
  string str_edge_weight_mode;
  HighsInt lc_edge_weight_mode;
  HighsInt iterSpeed;
  double dlTime;
  HighsInt dlIter;
  double toTime;
  HighsInt toIter;
  AnIterTraceRec *lcAnIter_3;
  HighsInt rec_1;
  double fmTime;
  HighsInt fmIter;
  AnIterTraceRec *lcAnIter;
  bool rp_primal_steepest_edge;
  bool rp_dual_steepest_edge;
  bool report_multi;
  AnIterTraceRec *lcAnIter_2;
  HighsInt rec;
  double su_pse_values;
  double su_dse_values;
  double su_multi_values;
  AnIterTraceRec *lcAnIter_1;
  bool add_extra_record;
  HighsInt pct_minor_iterations_performed;
  double average_heap_chuzc_size;
  double average_quad_chuzc_size;
  HighsInt suPrice;
  HighsInt lcNumInvert;
  HighsInt k_1;
  HighsInt last_rebuild_reason;
  HighsInt NumInvert;
  HighsInt lcNumNNz;
  HighsInt lcAnIterOpRsDim;
  double lcRsDensity;
  HighsInt pctHyperRs;
  HighsInt pctHyperOp;
  HighsInt lcHyperRs;
  HighsInt lcHyperOp;
  HighsInt lcNumCa;
  AnIterOpRec *AnIter;
  HighsInt k;
  HighsInt lc_EdWtNumIter;
  HighsInt AnIterNumIter;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe84;
  HighsTimer *in_stack_fffffffffffffe90;
  double local_158;
  double local_150;
  string local_120 [32];
  int local_100;
  uint local_fc;
  double local_f8;
  uint local_ec;
  double local_e8;
  uint local_dc;
  double *local_d8;
  int local_cc;
  double local_c8;
  uint local_bc;
  double *local_b8;
  byte local_ab;
  byte local_aa;
  byte local_a9;
  long local_a8;
  int local_9c;
  double local_98;
  double local_90;
  double local_88;
  double *local_80;
  byte local_75;
  uint local_74;
  double local_70;
  double local_68;
  uint local_5c;
  uint local_58;
  int local_54;
  undefined4 local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  double local_40;
  uint in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  uint in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int local_14;
  
  uVar2 = *(int *)(in_RDI + 0x104) - *(int *)(in_RDI + 0xa40);
  if ((0 < (int)uVar2) &&
     (printf("\nAnalysis of %d iterations (%d to %d)\n",(ulong)uVar2,
             (ulong)(*(int *)(in_RDI + 0xa40) + 1),(ulong)*(uint *)(in_RDI + 0x104)), 0 < (int)uVar2
     )) {
    uVar1 = *(uint *)(in_RDI + 0x1de8);
    if (0 < (int)uVar1) {
      printf("DSE for %12d (%3d%%) iterations\n",(ulong)uVar1,
             (long)(int)(uVar1 * 100) / (long)(int)uVar2 & 0xffffffff);
    }
    uVar1 = *(uint *)(in_RDI + 0x1de4);
    if (0 < (int)uVar1) {
      printf("Dvx for %12d (%3d%%) iterations\n",(ulong)uVar1,
             (long)(int)(uVar1 * 100) / (long)(int)uVar2 & 0xffffffff);
    }
    uVar1 = *(uint *)(in_RDI + 0x1de0);
    if (0 < (int)uVar1) {
      printf("Dan for %12d (%3d%%) iterations\n",(ulong)uVar1,
             (long)(int)(uVar1 * 100) / (long)(int)uVar2 & 0xffffffff);
    }
    for (local_14 = 0; local_14 < 10; local_14 = local_14 + 1) {
      lVar3 = in_RDI + 0xa48 + (long)local_14 * 0xe8;
      in_stack_ffffffffffffffdc = *(int *)(lVar3 + 0x14);
      uVar4 = std::__cxx11::string::c_str();
      printf("\n%-10s performed %d times\n",uVar4,(ulong)*(uint *)(lVar3 + 0x14));
      if (0 < in_stack_ffffffffffffffdc) {
        in_stack_ffffffffffffffd8 = *(uint *)(lVar3 + 0x18);
        in_stack_ffffffffffffffd4 = *(uint *)(lVar3 + 0x1c);
        in_stack_ffffffffffffffd0 =
             (int)(in_stack_ffffffffffffffd8 * 100) / in_stack_ffffffffffffffdc;
        in_stack_ffffffffffffffcc =
             (int)(in_stack_ffffffffffffffd4 * 100) / in_stack_ffffffffffffffdc;
        local_40 = pow(10.0,*(double *)(lVar3 + 0x20) / (double)in_stack_ffffffffffffffdc);
        local_44 = *(uint *)(lVar3 + 0x10);
        local_48 = (uint)(local_40 * (double)(int)local_44);
        printf("%12d hyper-sparse operations (%3d%%)\n",(ulong)in_stack_ffffffffffffffd8,
               (ulong)in_stack_ffffffffffffffd0);
        printf("%12d hyper-sparse results    (%3d%%)\n",(ulong)in_stack_ffffffffffffffd4,
               (ulong)in_stack_ffffffffffffffcc);
        printf("%12g density of result (%d / %d nonzeros)\n",local_40,(ulong)local_48,
               (ulong)local_44);
        logValueDistribution
                  ((HighsLogOptions *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                   (HighsValueDistribution *)
                   CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffcc);
      }
    }
    local_4c = 0;
    local_50 = 0xb;
    for (local_54 = 1; local_54 < 0xc; local_54 = local_54 + 1) {
      local_4c = *(int *)(in_RDI + 0x1db0 + (long)local_54 * 4) + local_4c;
    }
    if (0 < (int)local_4c) {
      local_58 = 0;
      printf("\nInvert    performed %d times: average frequency = %d\n",(ulong)local_4c,
             (long)(int)uVar2 / (long)(int)local_4c & 0xffffffff);
      local_58 = *(uint *)(in_RDI + 0x1db4);
      if (0 < (int)local_58) {
        printf("%12d (%3d%%) Invert operations due to update limit reached\n",(ulong)local_58,
               (long)(int)(local_58 * 100) / (long)(int)local_4c & 0xffffffff);
      }
      local_58 = *(uint *)(in_RDI + 0x1db8);
      if (0 < (int)local_58) {
        printf("%12d (%3d%%) Invert operations due to pseudo-clock\n",(ulong)local_58,
               (long)(int)(local_58 * 100) / (long)(int)local_4c & 0xffffffff);
      }
      local_58 = *(uint *)(in_RDI + 0x1dbc);
      if (0 < (int)local_58) {
        printf("%12d (%3d%%) Invert operations due to possibly optimal\n",(ulong)local_58,
               (long)(int)(local_58 * 100) / (long)(int)local_4c & 0xffffffff);
      }
      local_58 = *(uint *)(in_RDI + 0x1dc4);
      if (0 < (int)local_58) {
        printf("%12d (%3d%%) Invert operations due to possibly primal unbounded\n",(ulong)local_58,
               (long)(int)(local_58 * 100) / (long)(int)local_4c & 0xffffffff);
      }
      local_58 = *(uint *)(in_RDI + 0x1dc8);
      if (0 < (int)local_58) {
        printf("%12d (%3d%%) Invert operations due to possibly dual unbounded\n",(ulong)local_58,
               (long)(int)(local_58 * 100) / (long)(int)local_4c & 0xffffffff);
      }
      local_58 = *(uint *)(in_RDI + 0x1dcc);
      if (0 < (int)local_58) {
        printf("%12d (%3d%%) Invert operations due to possibly singular basis\n",(ulong)local_58,
               (long)(int)(local_58 * 100) / (long)(int)local_4c & 0xffffffff);
      }
      local_58 = *(uint *)(in_RDI + 0x1dd0);
      if (0 < (int)local_58) {
        printf("%12d (%3d%%) Invert operations due to primal infeasible in primal simplex\n",
               (ulong)local_58,(long)(int)(local_58 * 100) / (long)(int)local_4c & 0xffffffff);
      }
    }
    local_5c = *(int *)(in_RDI + 0x250) + *(int *)(in_RDI + 0x254) + *(int *)(in_RDI + 600);
    if (0 < (int)local_5c) {
      printf("\n%12d Price operations:\n",(ulong)local_5c);
      printf("%12d Col Price      (%3d%%)\n",(ulong)*(uint *)(in_RDI + 0x250),
             (long)(*(int *)(in_RDI + 0x250) * 100) / (long)(int)local_5c & 0xffffffff);
      printf("%12d Row Price      (%3d%%)\n",(ulong)*(uint *)(in_RDI + 0x254),
             (long)(*(int *)(in_RDI + 0x254) * 100) / (long)(int)local_5c & 0xffffffff);
      printf("%12d Row PriceWSw   (%3d%%)\n",(ulong)*(uint *)(in_RDI + 600),
             (long)(*(int *)(in_RDI + 600) * 100) / (long)(int)local_5c & 0xffffffff);
    }
    printf("\n%12d (%3d%%) costly DSE        iterations\n",(ulong)*(uint *)(in_RDI + 0x228),
           (long)(*(int *)(in_RDI + 0x228) * 100) / (long)(int)uVar2 & 0xffffffff);
    if (*(int *)(in_RDI + 0x1d0) != 0) {
      printf("\nDevex summary\n");
      printf("%12d Devex frameworks\n",(ulong)*(uint *)(in_RDI + 0x1d0));
      printf("%12d average number of iterations\n",
             (long)*(int *)(in_RDI + 0x1de4) / (long)*(int *)(in_RDI + 0x1d0) & 0xffffffff,
             (long)*(int *)(in_RDI + 0x1de4) % (long)*(int *)(in_RDI + 0x1d0) & 0xffffffff);
    }
    if (*(int *)(in_RDI + 0x850) + *(int *)(in_RDI + 0x854) != 0) {
      printf("\nCycling detected %d times:",
             (ulong)(uint)(*(int *)(in_RDI + 0x850) + *(int *)(in_RDI + 0x854)));
      if ((*(int *)(in_RDI + 0x850) != 0) &&
         (printf("%d in primal simplex",(ulong)*(uint *)(in_RDI + 0x850)),
         *(int *)(in_RDI + 0x854) != 0)) {
        printf("; ");
      }
      if (*(int *)(in_RDI + 0x854) != 0) {
        printf("%d in dual simplex",(ulong)*(uint *)(in_RDI + 0x854));
      }
      printf("\n");
    }
    if (*(int *)(in_RDI + 0x858) == 0) {
      local_150 = 0.0;
    }
    else {
      local_150 = *(double *)(in_RDI + 0x860) / (double)*(int *)(in_RDI + 0x858);
    }
    local_68 = local_150;
    if (*(int *)(in_RDI + 0x85c) == 0) {
      local_158 = 0.0;
    }
    else {
      local_158 = *(double *)(in_RDI + 0x868) / (double)*(int *)(in_RDI + 0x85c);
    }
    local_70 = local_158;
    if (*(int *)(in_RDI + 0x858) + *(int *)(in_RDI + 0x85c) != 0) {
      printf("\nQuad/heap CHUZC summary\n");
      if (*(int *)(in_RDI + 0x858) != 0) {
        printf("%12d quad CHUZC: average / max = %d / %d\n",(ulong)*(uint *)(in_RDI + 0x858),
               (ulong)(uint)(int)local_68,(ulong)*(uint *)(in_RDI + 0x870));
      }
      if (*(int *)(in_RDI + 0x85c) != 0) {
        printf("%12d heap CHUZC: average / max = %d / %d\n",(ulong)*(uint *)(in_RDI + 0x85c),
               (ulong)(uint)(int)local_70,(ulong)*(uint *)(in_RDI + 0x874));
      }
    }
    uVar4 = std::__cxx11::string::c_str();
    uVar5 = std::__cxx11::string::c_str();
    uVar8 = *(undefined4 *)(in_RDI + 0x85c);
    iVar6 = (int)local_70;
    printf("\ngrepQuadHeapChuzc,%s,%s, %d, ,%d,%d, %d, ,%d,%d\n",uVar4,uVar5,
           (ulong)*(uint *)(in_RDI + 0x858),(ulong)(uint)(int)local_68,
           (ulong)*(uint *)(in_RDI + 0x870),uVar8,iVar6,*(undefined4 *)(in_RDI + 0x874));
    if (-1 < *(int *)(in_RDI + 0x878)) {
      printf("\nDual_CHUZC: Number of improve CHUZC row calls =  %d\n",
             (ulong)*(uint *)(in_RDI + 0x878));
      printf("Dual_CHUZC: Number of pivots removed from pack = %d\n",
             (ulong)*(uint *)(in_RDI + 0x87c));
    }
    if (*(int *)(in_RDI + 0x880) + *(int *)(in_RDI + 0x898) + *(int *)(in_RDI + 0x8b4) != 0) {
      printf("\nFlip/shift summary\n");
      if (*(int *)(in_RDI + 0x880) != 0) {
        printf("%12d   correct dual primal flips (max = %g) for min dual infeasibility = %g\n",
               *(undefined8 *)(in_RDI + 0x890),(int)*(undefined8 *)(in_RDI + 0x888),
               (ulong)*(uint *)(in_RDI + 0x880));
      }
      if (*(int *)(in_RDI + 0x898) != 0) {
        printf("%12d   correct dual  cost shifts (max = %g) for max dual infeasibility = %g\n",
               *(undefined8 *)(in_RDI + 0x8a8),(int)*(undefined8 *)(in_RDI + 0x8a0),
               (ulong)*(uint *)(in_RDI + 0x898));
      }
      if (*(int *)(in_RDI + 0x8b4) != 0) {
        printf("%12d   single        cost shifts (sum / max = %g / %g)\n",
               *(undefined8 *)(in_RDI + 0x8c0),(int)*(undefined8 *)(in_RDI + 0x8b8),
               (ulong)*(uint *)(in_RDI + 0x8b4));
      }
    }
    uVar4 = std::__cxx11::string::c_str();
    uVar5 = std::__cxx11::string::c_str();
    printf("\ngrepFlipShift,%s,%s,%d,%g,%g,%d,%g,%g,%d,%g,%g\n",*(undefined8 *)(in_RDI + 0x890),
           (int)*(undefined8 *)(in_RDI + 0x888),*(undefined8 *)(in_RDI + 0x8a8),
           *(undefined8 *)(in_RDI + 0x8a0),*(undefined8 *)(in_RDI + 0x8c0),
           *(undefined8 *)(in_RDI + 0x8b8),uVar4,uVar5,(ulong)*(uint *)(in_RDI + 0x880),
           (ulong)*(uint *)(in_RDI + 0x898),(ulong)*(uint *)(in_RDI + 0x8b4));
    if (0 < *(int *)(in_RDI + 0x9e0)) {
      local_74 = (*(int *)(in_RDI + 0x9e4) * 100) / *(int *)(in_RDI + 0x9e0);
      printf("\nPAMI summary: for average of %0.1g threads \n",*(undefined8 *)(in_RDI + 0x9d0));
      printf("%12d Major iterations\n",(ulong)*(uint *)(in_RDI + 0x238));
      printf("%12d Minor iterations\n",(ulong)*(uint *)(in_RDI + 0x9e4));
      printf("%12d Total rows chosen: performed %3d%% of possible minor iterations\n\n",
             (ulong)*(uint *)(in_RDI + 0x9e0),(ulong)local_74);
    }
    highsLogDev((HighsLogOptions *)(in_RDI + 0x90),kInfo,"\nCost perturbation summary\n");
    logValueDistribution
              ((HighsLogOptions *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               (HighsValueDistribution *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc);
    logValueDistribution
              ((HighsLogOptions *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               (HighsValueDistribution *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc);
    logValueDistribution
              ((HighsLogOptions *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               (HighsValueDistribution *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc);
    logValueDistribution
              ((HighsLogOptions *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               (HighsValueDistribution *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc);
    logValueDistribution
              ((HighsLogOptions *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               (HighsValueDistribution *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc);
    logValueDistribution
              ((HighsLogOptions *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               (HighsValueDistribution *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc);
    logValueDistribution
              ((HighsLogOptions *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               (HighsValueDistribution *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc);
    logValueDistribution
              ((HighsLogOptions *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               (HighsValueDistribution *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc);
    logValueDistribution
              ((HighsLogOptions *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               (HighsValueDistribution *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc);
    logValueDistribution
              ((HighsLogOptions *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               (HighsValueDistribution *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc);
    logValueDistribution
              ((HighsLogOptions *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               (HighsValueDistribution *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc);
    logValueDistribution
              ((HighsLogOptions *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               (HighsValueDistribution *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc);
    logValueDistribution
              ((HighsLogOptions *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               (HighsValueDistribution *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc);
    logValueDistribution
              ((HighsLogOptions *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               (HighsValueDistribution *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc);
    logValueDistribution
              ((HighsLogOptions *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               (HighsValueDistribution *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc);
    logValueDistribution
              ((HighsLogOptions *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               (HighsValueDistribution *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc);
    if (99 < *(int *)(in_RDI + 0x135c)) {
      local_75 = *(int *)(in_RDI + (long)*(int *)(in_RDI + 0x1358) * 0x78 + 0x13c8) <
                 *(int *)(in_RDI + 0x104);
      if ((bool)local_75) {
        *(int *)(in_RDI + 0x1358) = *(int *)(in_RDI + 0x1358) + 1;
        local_80 = (double *)(in_RDI + 0x1360 + (long)*(int *)(in_RDI + 0x1358) * 0x78);
        *(undefined4 *)(local_80 + 0xd) = *(undefined4 *)(in_RDI + 0x104);
        dVar7 = HighsTimer::getWallTime(in_stack_fffffffffffffe90);
        *local_80 = dVar7;
        if (*(double *)(in_RDI + 0x9d8) <= 0.0) {
          local_80[1] = 0.0;
        }
        else {
          local_80[1] = *(double *)(in_RDI + 0x9d8);
        }
        local_80[8] = *(double *)(in_RDI + 0x1d8);
        local_80[6] = *(double *)(in_RDI + 0x1e0);
        local_80[7] = *(double *)(in_RDI + 0x1e8);
        local_80[9] = *(double *)(in_RDI + 0x1d8);
        if (*(int *)(in_RDI + 0xfc) == 2) {
          local_80[10] = *(double *)(in_RDI + 0x1f0);
          local_80[0xb] = *(double *)(in_RDI + 0x1f8);
          local_80[0xc] = *(double *)(in_RDI + 0x230);
        }
        else {
          local_80[10] = 0.0;
          local_80[0xc] = 0.0;
        }
        *(undefined4 *)((long)local_80 + 0x6c) = *(undefined4 *)(in_RDI + 0xf8);
        *(undefined4 *)(local_80 + 0xe) = *(undefined4 *)(in_RDI + 0xfc);
      }
      local_88 = 0.0;
      local_90 = 0.0;
      local_98 = 0.0;
      for (local_9c = 1; local_9c <= *(int *)(in_RDI + 0x1358); local_9c = local_9c + 1) {
        local_a8 = in_RDI + 0x1360 + (long)local_9c * 0x78;
        local_88 = ABS(*(double *)(local_a8 + 8)) + local_88;
        local_90 = ABS(*(double *)(local_a8 + 0x50)) + local_90;
        local_98 = ABS(*(double *)(local_a8 + 0x58)) + local_98;
      }
      local_a9 = 0.0 < local_88;
      local_aa = 0.0 < local_90;
      local_ab = 0.0 < local_98;
      printf("\n Iteration speed analysis\n");
      local_b8 = (double *)(in_RDI + 0x1360);
      local_bc = *(uint *)(in_RDI + 0x13c8);
      local_c8 = *local_b8;
      printf("        Iter (      FmIter:      ToIter)      Time      Iter/sec ");
      if ((local_a9 & 1) != 0) {
        printf("| PAMI ");
      }
      printf("| C_Aq R_Ep R_Ap ");
      if ((local_aa & 1) != 0) {
        printf(" DSE ");
      }
      if ((local_ab & 1) != 0) {
        printf(" PSE ");
      }
      printf("| EdWt ");
      if ((local_aa & 1) == 0) {
        printf("\n");
      }
      else {
        printf("| CostlyDse\n");
      }
      for (local_cc = 1; local_cc <= *(int *)(in_RDI + 0x1358); local_cc = local_cc + 1) {
        local_d8 = (double *)(in_RDI + 0x1360 + (long)local_cc * 0x78);
        local_dc = *(uint *)(local_d8 + 0xd);
        local_e8 = *local_d8;
        local_ec = local_dc - local_bc;
        if ((local_cc < *(int *)(in_RDI + 0x1358)) && (local_ec != *(uint *)(in_RDI + 0x135c))) {
          printf("STRANGE: %d = dlIter != AnIterTraceIterDl = %d\n",(ulong)local_ec,
                 (ulong)*(uint *)(in_RDI + 0x135c));
        }
        local_f8 = local_e8 - local_c8;
        local_fc = 0;
        if (0.0 < local_f8) {
          local_fc = (uint)((double)(int)local_ec / local_f8);
        }
        local_100 = *(int *)(local_d8 + 0xe);
        std::__cxx11::string::string(local_120);
        if (local_100 == 2) {
          std::__cxx11::string::operator=(local_120,"DSE");
        }
        else if (local_100 == 1) {
          std::__cxx11::string::operator=(local_120,"Dvx");
        }
        else if (local_100 == 0) {
          std::__cxx11::string::operator=(local_120,"Dan");
        }
        else {
          std::__cxx11::string::operator=(local_120,"XXX");
        }
        printf("%12d (%12d:%12d) %9.4f  %12d ",local_f8,(ulong)local_ec,(ulong)local_bc,
               (ulong)local_dc,(ulong)local_fc);
        if ((local_a9 & 1) != 0) {
          printf("|  %3d ",(ulong)(uint)(int)(local_d8[1] * 100.0));
        }
        printf("|");
        printOneDensity((HighsSimplexAnalysis *)CONCAT44(in_stack_fffffffffffffe84,iVar6),
                        (double)CONCAT44(in_stack_fffffffffffffe7c,uVar8));
        printOneDensity((HighsSimplexAnalysis *)CONCAT44(in_stack_fffffffffffffe84,iVar6),
                        (double)CONCAT44(in_stack_fffffffffffffe7c,uVar8));
        printOneDensity((HighsSimplexAnalysis *)CONCAT44(in_stack_fffffffffffffe84,iVar6),
                        (double)CONCAT44(in_stack_fffffffffffffe7c,uVar8));
        if ((local_aa & 1) != 0) {
          printOneDensity((HighsSimplexAnalysis *)CONCAT44(in_stack_fffffffffffffe84,iVar6),
                          (double)CONCAT44(in_stack_fffffffffffffe7c,uVar8));
        }
        uVar4 = std::__cxx11::string::c_str();
        printf(" |  %3s ",uVar4);
        if ((local_aa & 1) != 0) {
          printf("|     ");
          printOneDensity((HighsSimplexAnalysis *)CONCAT44(in_stack_fffffffffffffe84,iVar6),
                          (double)CONCAT44(in_stack_fffffffffffffe7c,uVar8));
        }
        printf("\n");
        local_bc = local_dc;
        local_c8 = local_e8;
        std::__cxx11::string::~string(local_120);
      }
      printf("\n");
      if ((local_75 & 1) != 0) {
        *(int *)(in_RDI + 0x1358) = *(int *)(in_RDI + 0x1358) + -1;
      }
    }
  }
  return;
}

Assistant:

void HighsSimplexAnalysis::summaryReport() {
  assert(analyse_simplex_summary_data);
  HighsInt AnIterNumIter = simplex_iteration_count - AnIterIt0;
  if (AnIterNumIter <= 0) return;
  printf("\nAnalysis of %" HIGHSINT_FORMAT " iterations (%" HIGHSINT_FORMAT
         " to %" HIGHSINT_FORMAT ")\n",
         AnIterNumIter, AnIterIt0 + 1, simplex_iteration_count);
  if (AnIterNumIter <= 0) return;
  HighsInt lc_EdWtNumIter;
  lc_EdWtNumIter = AnIterNumEdWtIt[(HighsInt)EdgeWeightMode::kSteepestEdge];
  if (lc_EdWtNumIter > 0)
    printf("DSE for %12" HIGHSINT_FORMAT " (%3" HIGHSINT_FORMAT
           "%%) iterations\n",
           lc_EdWtNumIter, (100 * lc_EdWtNumIter) / AnIterNumIter);
  lc_EdWtNumIter = AnIterNumEdWtIt[(HighsInt)EdgeWeightMode::kDevex];
  if (lc_EdWtNumIter > 0)
    printf("Dvx for %12" HIGHSINT_FORMAT " (%3" HIGHSINT_FORMAT
           "%%) iterations\n",
           lc_EdWtNumIter, (100 * lc_EdWtNumIter) / AnIterNumIter);
  lc_EdWtNumIter = AnIterNumEdWtIt[(HighsInt)EdgeWeightMode::kDantzig];
  if (lc_EdWtNumIter > 0)
    printf("Dan for %12" HIGHSINT_FORMAT " (%3" HIGHSINT_FORMAT
           "%%) iterations\n",
           lc_EdWtNumIter, (100 * lc_EdWtNumIter) / AnIterNumIter);
  for (HighsInt k = 0; k < kNumSimplexNlaOperation; k++) {
    AnIterOpRec& AnIter = AnIterOp[k];
    HighsInt lcNumCa = AnIter.AnIterOpNumCa;
    printf("\n%-10s performed %" HIGHSINT_FORMAT " times\n",
           AnIter.AnIterOpName.c_str(), AnIter.AnIterOpNumCa);
    if (lcNumCa > 0) {
      HighsInt lcHyperOp = AnIter.AnIterOpNumHyperOp;
      HighsInt lcHyperRs = AnIter.AnIterOpNumHyperRs;
      HighsInt pctHyperOp = (100 * lcHyperOp) / lcNumCa;
      HighsInt pctHyperRs = (100 * lcHyperRs) / lcNumCa;
      double lcRsDensity =
          pow(10.0, AnIter.AnIterOpSumLog10RsDensity / lcNumCa);
      HighsInt lcAnIterOpRsDim = AnIter.AnIterOpRsDim;
      HighsInt lcNumNNz = lcRsDensity * lcAnIterOpRsDim;
      printf("%12" HIGHSINT_FORMAT
             " hyper-sparse operations (%3" HIGHSINT_FORMAT "%%)\n",
             lcHyperOp, pctHyperOp);
      printf("%12" HIGHSINT_FORMAT
             " hyper-sparse results    (%3" HIGHSINT_FORMAT "%%)\n",
             lcHyperRs, pctHyperRs);
      printf("%12g density of result (%" HIGHSINT_FORMAT " / %" HIGHSINT_FORMAT
             " nonzeros)\n",
             lcRsDensity, lcNumNNz, lcAnIterOpRsDim);
      logValueDistribution(log_options, AnIter.AnIterOp_density,
                           AnIter.AnIterOpRsDim);
    }
  }
  HighsInt NumInvert = 0;

  HighsInt last_rebuild_reason = kRebuildReasonCount - 1;
  for (HighsInt k = 1; k <= last_rebuild_reason; k++)
    NumInvert += AnIterNumInvert[k];
  if (NumInvert > 0) {
    HighsInt lcNumInvert = 0;
    printf("\nInvert    performed %" HIGHSINT_FORMAT
           " times: average frequency = %" HIGHSINT_FORMAT "\n",
           NumInvert, AnIterNumIter / NumInvert);
    lcNumInvert = AnIterNumInvert[kRebuildReasonUpdateLimitReached];
    if (lcNumInvert > 0)
      printf("%12" HIGHSINT_FORMAT " (%3" HIGHSINT_FORMAT
             "%%) Invert operations due to update limit reached\n",
             lcNumInvert, (100 * lcNumInvert) / NumInvert);
    lcNumInvert = AnIterNumInvert[kRebuildReasonSyntheticClockSaysInvert];
    if (lcNumInvert > 0)
      printf("%12" HIGHSINT_FORMAT " (%3" HIGHSINT_FORMAT
             "%%) Invert operations due to pseudo-clock\n",
             lcNumInvert, (100 * lcNumInvert) / NumInvert);
    lcNumInvert = AnIterNumInvert[kRebuildReasonPossiblyOptimal];
    if (lcNumInvert > 0)
      printf("%12" HIGHSINT_FORMAT " (%3" HIGHSINT_FORMAT
             "%%) Invert operations due to possibly optimal\n",
             lcNumInvert, (100 * lcNumInvert) / NumInvert);
    lcNumInvert = AnIterNumInvert[kRebuildReasonPossiblyPrimalUnbounded];
    if (lcNumInvert > 0)
      printf("%12" HIGHSINT_FORMAT " (%3" HIGHSINT_FORMAT
             "%%) Invert operations due to possibly primal unbounded\n",
             lcNumInvert, (100 * lcNumInvert) / NumInvert);
    lcNumInvert = AnIterNumInvert[kRebuildReasonPossiblyDualUnbounded];
    if (lcNumInvert > 0)
      printf("%12" HIGHSINT_FORMAT " (%3" HIGHSINT_FORMAT
             "%%) Invert operations due to possibly dual unbounded\n",
             lcNumInvert, (100 * lcNumInvert) / NumInvert);
    lcNumInvert = AnIterNumInvert[kRebuildReasonPossiblySingularBasis];
    if (lcNumInvert > 0)
      printf("%12" HIGHSINT_FORMAT " (%3" HIGHSINT_FORMAT
             "%%) Invert operations due to possibly singular basis\n",
             lcNumInvert, (100 * lcNumInvert) / NumInvert);
    lcNumInvert =
        AnIterNumInvert[kRebuildReasonPrimalInfeasibleInPrimalSimplex];
    if (lcNumInvert > 0)
      printf("%12" HIGHSINT_FORMAT " (%3" HIGHSINT_FORMAT
             "%%) Invert operations due to primal infeasible in primal "
             "simplex\n",
             lcNumInvert, (100 * lcNumInvert) / NumInvert);
  }
  HighsInt suPrice = num_col_price + num_row_price + num_row_price_with_switch;
  if (suPrice > 0) {
    printf("\n%12" HIGHSINT_FORMAT " Price operations:\n", suPrice);
    printf("%12" HIGHSINT_FORMAT " Col Price      (%3" HIGHSINT_FORMAT "%%)\n",
           num_col_price, (100 * num_col_price) / suPrice);
    printf("%12" HIGHSINT_FORMAT " Row Price      (%3" HIGHSINT_FORMAT "%%)\n",
           num_row_price, (100 * num_row_price) / suPrice);
    printf("%12" HIGHSINT_FORMAT " Row PriceWSw   (%3" HIGHSINT_FORMAT "%%)\n",
           num_row_price_with_switch,
           (100 * num_row_price_with_switch / suPrice));
  }
  printf("\n%12" HIGHSINT_FORMAT " (%3" HIGHSINT_FORMAT
         "%%) costly DSE        iterations\n",
         num_costly_DSE_iteration,
         (100 * num_costly_DSE_iteration) / AnIterNumIter);

  // Look for any Devex data to summarise
  if (num_devex_framework) {
    printf("\nDevex summary\n");
    printf("%12" HIGHSINT_FORMAT " Devex frameworks\n", num_devex_framework);
    printf("%12" HIGHSINT_FORMAT " average number of iterations\n",
           AnIterNumEdWtIt[(HighsInt)EdgeWeightMode::kDevex] /
               num_devex_framework);
  }

  if (num_primal_cycling_detections + num_dual_cycling_detections) {
    printf("\nCycling detected %" HIGHSINT_FORMAT " times:",
           num_primal_cycling_detections + num_dual_cycling_detections);
    if (num_primal_cycling_detections) {
      printf("%" HIGHSINT_FORMAT " in primal simplex",
             num_primal_cycling_detections);
      if (num_dual_cycling_detections) printf("; ");
    }
    if (num_dual_cycling_detections)
      printf("%" HIGHSINT_FORMAT " in dual simplex",
             num_dual_cycling_detections);
    printf("\n");
  }

  const double average_quad_chuzc_size =
      num_quad_chuzc ? sum_quad_chuzc_size / num_quad_chuzc : 0;
  const double average_heap_chuzc_size =
      num_heap_chuzc ? sum_heap_chuzc_size / num_heap_chuzc : 0;
  if (num_quad_chuzc + num_heap_chuzc) {
    printf("\nQuad/heap CHUZC summary\n");
    if (num_quad_chuzc)
      printf("%12" HIGHSINT_FORMAT
             " quad CHUZC: average / max = %d / %" HIGHSINT_FORMAT "\n",
             num_quad_chuzc, (int)average_quad_chuzc_size, max_quad_chuzc_size);
    if (num_heap_chuzc)
      printf("%12" HIGHSINT_FORMAT
             " heap CHUZC: average / max = %d / %" HIGHSINT_FORMAT "\n",
             num_heap_chuzc, (int)average_heap_chuzc_size, max_heap_chuzc_size);
  }
  printf("\ngrepQuadHeapChuzc,%s,%s, %" HIGHSINT_FORMAT
         ", ,%d,%" HIGHSINT_FORMAT ", %" HIGHSINT_FORMAT
         ", ,%d,%" HIGHSINT_FORMAT "\n",
         model_name_.c_str(), lp_name_.c_str(), num_quad_chuzc,
         (int)average_quad_chuzc_size, max_quad_chuzc_size, num_heap_chuzc,
         (int)average_heap_chuzc_size, max_heap_chuzc_size);

  if (num_improve_choose_column_row_call >= 0) {
    printf("\nDual_CHUZC: Number of improve CHUZC row calls =  %d\n",
           (int)num_improve_choose_column_row_call);
    printf("Dual_CHUZC: Number of pivots removed from pack = %d\n",
           (int)num_remove_pivot_from_pack);
  } else {
    assert(num_remove_pivot_from_pack == 0);
  }

  if (num_correct_dual_primal_flip + num_correct_dual_cost_shift +
      num_single_cost_shift) {
    printf("\nFlip/shift summary\n");
    if (num_correct_dual_primal_flip) {
      printf(
          "%12" HIGHSINT_FORMAT
          "   correct dual primal flips (max = %g) for min dual infeasibility "
          "= %g\n",
          num_correct_dual_primal_flip, max_correct_dual_primal_flip,
          min_correct_dual_primal_flip_dual_infeasibility);
    }
    if (num_correct_dual_cost_shift) {
      printf(
          "%12" HIGHSINT_FORMAT
          "   correct dual  cost shifts (max = %g) for max dual infeasibility "
          "= %g\n",
          num_correct_dual_cost_shift, max_correct_dual_cost_shift,
          max_correct_dual_cost_shift_dual_infeasibility);
    }
    if (num_single_cost_shift) {
      printf("%12" HIGHSINT_FORMAT
             "   single        cost shifts (sum / max = %g / %g)\n",
             num_single_cost_shift, sum_single_cost_shift,
             max_single_cost_shift);
    }
  }
  printf("\ngrepFlipShift,%s,%s,%" HIGHSINT_FORMAT ",%g,%g,%" HIGHSINT_FORMAT
         ",%g,%g,%" HIGHSINT_FORMAT ",%g,%g\n",
         model_name_.c_str(), lp_name_.c_str(), num_correct_dual_primal_flip,
         max_correct_dual_primal_flip,
         min_correct_dual_primal_flip_dual_infeasibility,
         num_correct_dual_cost_shift, max_correct_dual_cost_shift,
         max_correct_dual_cost_shift_dual_infeasibility, num_single_cost_shift,
         sum_single_cost_shift, max_single_cost_shift);

  // Look for any PAMI data to summarise
  if (sum_multi_chosen > 0) {
    const HighsInt pct_minor_iterations_performed =
        (100 * sum_multi_finished) / sum_multi_chosen;
    printf("\nPAMI summary: for average of %0.1g threads \n",
           average_concurrency);
    printf("%12" HIGHSINT_FORMAT " Major iterations\n", multi_iteration_count);
    printf("%12" HIGHSINT_FORMAT " Minor iterations\n", sum_multi_finished);
    printf("%12" HIGHSINT_FORMAT
           " Total rows chosen: performed %3" HIGHSINT_FORMAT
           "%% of possible minor "
           "iterations\n\n",
           sum_multi_chosen, pct_minor_iterations_performed);
  }

  highsLogDev(log_options, HighsLogType::kInfo,
              "\nCost perturbation summary\n");
  logValueDistribution(log_options, cost_perturbation1_distribution);
  logValueDistribution(log_options, cost_perturbation2_distribution);

  logValueDistribution(log_options, before_ftran_upper_sparse_density, numRow);
  logValueDistribution(log_options, ftran_upper_sparse_density, numRow);
  logValueDistribution(log_options, before_ftran_upper_hyper_density, numRow);
  logValueDistribution(log_options, ftran_upper_hyper_density, numRow);
  logValueDistribution(log_options, primal_step_distribution);
  logValueDistribution(log_options, dual_step_distribution);
  logValueDistribution(log_options, simplex_pivot_distribution);
  logValueDistribution(log_options, factor_pivot_threshold_distribution);
  logValueDistribution(log_options, numerical_trouble_distribution);
  logValueDistribution(log_options, edge_weight_error_distribution);
  logValueDistribution(log_options, cleanup_dual_change_distribution);
  logValueDistribution(log_options, cleanup_primal_step_distribution);
  logValueDistribution(log_options, cleanup_dual_step_distribution);
  logValueDistribution(log_options, cleanup_primal_change_distribution);

  if (AnIterTraceIterDl >= 100) {
    // Possibly (usually) add a temporary record for the final
    // iterations: may end up with one more than
    // kAnIterTraceMaxNumRec records, so ensure that there is
    // enough space in the arrays
    //
    const bool add_extra_record =
        simplex_iteration_count >
        AnIterTrace[AnIterTraceNumRec].AnIterTraceIter;
    if (add_extra_record) {
      AnIterTraceNumRec++;
      AnIterTraceRec& lcAnIter = AnIterTrace[AnIterTraceNumRec];
      lcAnIter.AnIterTraceIter = simplex_iteration_count;
      lcAnIter.AnIterTraceTime = timer_->getWallTime();
      if (average_fraction_of_possible_minor_iterations_performed > 0) {
        lcAnIter.AnIterTraceMulti =
            average_fraction_of_possible_minor_iterations_performed;
      } else {
        lcAnIter.AnIterTraceMulti = 0;
      }
      lcAnIter.AnIterTraceDensity[kSimplexNlaFtran] = col_aq_density;
      lcAnIter.AnIterTraceDensity[kSimplexNlaBtranEp] = row_ep_density;
      lcAnIter.AnIterTraceDensity[kSimplexNlaPriceAp] = row_ap_density;
      lcAnIter.AnIterTraceDensity[kSimplexNlaFtranBfrt] = col_aq_density;
      if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
        lcAnIter.AnIterTraceDensity[kSimplexNlaFtranDse] = row_DSE_density;
        lcAnIter.AnIterTraceDensity[kSimplexNlaBtranPse] =
            col_steepest_edge_density;
        lcAnIter.AnIterTraceCostlyDse = costly_DSE_measure;
      } else {
        lcAnIter.AnIterTraceDensity[kSimplexNlaFtranDse] = 0;
        lcAnIter.AnIterTraceCostlyDse = 0;
      }
      lcAnIter.AnIterTrace_simplex_strategy = (HighsInt)simplex_strategy;
      lcAnIter.AnIterTrace_edge_weight_mode = (HighsInt)edge_weight_mode;
    }
    // Determine whether the Multi and steepest edge columns should be reported
    double su_multi_values = 0;
    double su_dse_values = 0;
    double su_pse_values = 0;
    for (HighsInt rec = 1; rec <= AnIterTraceNumRec; rec++) {
      AnIterTraceRec& lcAnIter = AnIterTrace[rec];
      su_multi_values += fabs(lcAnIter.AnIterTraceMulti);
      su_dse_values += fabs(lcAnIter.AnIterTraceDensity[kSimplexNlaFtranDse]);
      su_pse_values += fabs(lcAnIter.AnIterTraceDensity[kSimplexNlaBtranPse]);
    }
    const bool report_multi = su_multi_values > 0;
    const bool rp_dual_steepest_edge = su_dse_values > 0;
    const bool rp_primal_steepest_edge = su_pse_values > 0;
    printf("\n Iteration speed analysis\n");
    AnIterTraceRec& lcAnIter = AnIterTrace[0];
    HighsInt fmIter = lcAnIter.AnIterTraceIter;
    double fmTime = lcAnIter.AnIterTraceTime;
    printf("        Iter (      FmIter:      ToIter)      Time      Iter/sec ");
    if (report_multi) printf("| PAMI ");
    printf("| C_Aq R_Ep R_Ap ");
    if (rp_dual_steepest_edge) printf(" DSE ");
    if (rp_primal_steepest_edge) printf(" PSE ");
    printf("| EdWt ");
    if (rp_dual_steepest_edge) {
      printf("| CostlyDse\n");
    } else {
      printf("\n");
    }

    for (HighsInt rec = 1; rec <= AnIterTraceNumRec; rec++) {
      AnIterTraceRec& lcAnIter = AnIterTrace[rec];
      HighsInt toIter = lcAnIter.AnIterTraceIter;
      double toTime = lcAnIter.AnIterTraceTime;
      HighsInt dlIter = toIter - fmIter;
      if (rec < AnIterTraceNumRec && dlIter != AnIterTraceIterDl)
        printf("STRANGE: %" HIGHSINT_FORMAT
               " = dlIter != AnIterTraceIterDl = %" HIGHSINT_FORMAT "\n",
               dlIter, AnIterTraceIterDl);
      double dlTime = toTime - fmTime;
      HighsInt iterSpeed = 0;
      if (dlTime > 0) iterSpeed = dlIter / dlTime;
      HighsInt lc_edge_weight_mode = lcAnIter.AnIterTrace_edge_weight_mode;
      std::string str_edge_weight_mode;
      if (lc_edge_weight_mode == (HighsInt)EdgeWeightMode::kSteepestEdge)
        str_edge_weight_mode = "DSE";
      else if (lc_edge_weight_mode == (HighsInt)EdgeWeightMode::kDevex)
        str_edge_weight_mode = "Dvx";
      else if (lc_edge_weight_mode == (HighsInt)EdgeWeightMode::kDantzig)
        str_edge_weight_mode = "Dan";
      else
        str_edge_weight_mode = "XXX";
      printf("%12" HIGHSINT_FORMAT " (%12" HIGHSINT_FORMAT
             ":%12" HIGHSINT_FORMAT ") %9.4f  %12" HIGHSINT_FORMAT " ",
             dlIter, fmIter, toIter, dlTime, iterSpeed);
      if (report_multi) {
        const HighsInt pct = (100 * lcAnIter.AnIterTraceMulti);
        printf("|  %3" HIGHSINT_FORMAT " ", pct);
      }
      printf("|");
      printOneDensity(lcAnIter.AnIterTraceDensity[kSimplexNlaFtran]);
      printOneDensity(lcAnIter.AnIterTraceDensity[kSimplexNlaBtranEp]);
      printOneDensity(lcAnIter.AnIterTraceDensity[kSimplexNlaPriceAp]);
      if (rp_dual_steepest_edge) {
        double use_DSE_density;
        if (lc_edge_weight_mode == (HighsInt)EdgeWeightMode::kSteepestEdge) {
          use_DSE_density = lcAnIter.AnIterTraceDensity[kSimplexNlaFtranDse];
        } else {
          use_DSE_density = 0;
        }
        printOneDensity(use_DSE_density);
      }
      printf(" |  %3s ", str_edge_weight_mode.c_str());
      if (rp_dual_steepest_edge) {
        double use_costly_dse;
        printf("|     ");
        if (lc_edge_weight_mode == (HighsInt)EdgeWeightMode::kSteepestEdge) {
          use_costly_dse = lcAnIter.AnIterTraceCostlyDse;
        } else {
          use_costly_dse = 0;
        }
        printOneDensity(use_costly_dse);
      }
      printf("\n");
      fmIter = toIter;
      fmTime = toTime;
    }
    printf("\n");
    // Remove any temporary record added for the final iterations
    if (add_extra_record) AnIterTraceNumRec--;
  }
}